

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int binstrcaseless(bstring b1,int pos,bstring b2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  __int32_t **pp_Var6;
  uint uVar7;
  long lVar8;
  uchar *puVar9;
  uint uVar10;
  
  if (b1 == (bstring)0x0) {
    return -1;
  }
  puVar9 = b1->data;
  if ((((puVar9 != (uchar *)0x0) && (uVar3 = b1->slen, b2 != (bstring)0x0 && -1 < (int)uVar3)) &&
      (puVar5 = b2->data, puVar5 != (uchar *)0x0)) && (iVar4 = b2->slen, -1 < iVar4)) {
    if (uVar3 == pos) {
      return -(uint)(iVar4 != 0) | pos;
    }
    if ((uint)pos <= uVar3) {
      if (iVar4 == 0) {
        return pos;
      }
      if (pos <= (int)(uVar3 - iVar4)) {
        if (pos == 0 && puVar9 == puVar5) {
          return 0;
        }
        puVar9 = puVar9 + pos;
LAB_00111bd5:
        lVar8 = 0;
        do {
          bVar1 = puVar5[lVar8];
          uVar10 = (uint)bVar1;
          bVar2 = puVar9[lVar8];
          uVar7 = (uint)bVar2;
          if (bVar1 != bVar2) {
            if (-1 < (char)bVar1) {
              pp_Var6 = __ctype_tolower_loc();
              uVar10 = (*pp_Var6)[bVar1];
            }
            if (-1 < (char)bVar2) {
              pp_Var6 = __ctype_tolower_loc();
              uVar7 = (*pp_Var6)[bVar2];
            }
            if (uVar10 != uVar7) goto LAB_00111c24;
          }
          lVar8 = lVar8 + 1;
          if (iVar4 <= (int)lVar8) {
            return pos;
          }
        } while( true );
      }
    }
  }
  return -1;
LAB_00111c24:
  if ((int)(uVar3 - iVar4) <= pos) {
    return -1;
  }
  pos = pos + 1;
  puVar9 = puVar9 + 1;
  goto LAB_00111bd5;
}

Assistant:

int binstrcaseless (const bstring b1, int pos, const bstring b2) {
int j, i, l, ll;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos) return (b2->slen == 0)?pos:BSTR_ERR;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	l = b1->slen - b2->slen + 1;

	/* No space to find such a string? */
	if (l <= pos) return BSTR_ERR;

	/* An obvious alias case */
	if (b1->data == b2->data && pos == 0) return 0;

	i = pos;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	ll = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j] || downcase (d0[j]) == downcase (d1[i + j])) {
			j ++;
			if (j >= ll) return i;
		} else {
			i ++;
			if (i >= l) break;
			j=0;
		}
	}

	return BSTR_ERR;
}